

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

void BaseMap_Init(TFileStream *pStream)

{
  TFileStream *pStream_local;
  
  pStream->BaseOpen = BaseMap_Open;
  pStream->BaseRead = BaseMap_Read;
  pStream->BaseGetSize = BaseFile_GetSize;
  pStream->BaseGetPos = BaseFile_GetPos;
  pStream->BaseClose = BaseMap_Close;
  pStream->dwFlags = pStream->dwFlags | 0x100;
  return;
}

Assistant:

static void BaseMap_Init(TFileStream * pStream)
{
    // Supply the file stream functions
    pStream->BaseOpen    = BaseMap_Open;
    pStream->BaseRead    = BaseMap_Read;
    pStream->BaseGetSize = BaseFile_GetSize;    // Reuse BaseFile function
    pStream->BaseGetPos  = BaseFile_GetPos;     // Reuse BaseFile function
    pStream->BaseClose   = BaseMap_Close;

    // Mapped files are read-only
    pStream->dwFlags |= STREAM_FLAG_READ_ONLY;
}